

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

int StateLifeTokens(pyhanabi_state_t *state)

{
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x1ce,"int StateLifeTokens(pyhanabi_state_t *)");
  }
  if (state->state != (void *)0x0) {
    return *(int *)((long)state->state + 0x7c);
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x1cf,"int StateLifeTokens(pyhanabi_state_t *)");
}

Assistant:

int StateLifeTokens(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->LifeTokens();
}